

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int cram_flush_result(cram_fd *fd)

{
  undefined8 *puVar1;
  cram_container *c;
  int iVar2;
  t_pool_result *r;
  long lVar3;
  uint uVar4;
  
  uVar4 = 0;
  while( true ) {
    r = t_pool_next_result(fd->rqueue);
    if (r == (t_pool_result *)0x0) {
      return uVar4;
    }
    puVar1 = (undefined8 *)r->data;
    if (puVar1 == (undefined8 *)0x0) break;
    fd = (cram_fd *)*puVar1;
    c = (cram_container *)puVar1[1];
    iVar2 = cram_flush_container2(fd,c);
    if (iVar2 != 0) {
      return -1;
    }
    for (lVar3 = 0; lVar3 < c->max_slice; lVar3 = lVar3 + 1) {
      cram_free_slice(c->slices[lVar3]);
      c->slices[lVar3] = (cram_slice *)0x0;
    }
    c->slice = (cram_slice *)0x0;
    c->curr_slice = 0;
    cram_free_container(c);
    iVar2 = hflush(fd->fp);
    uVar4 = uVar4 | -(uint)(iVar2 != 0);
    t_pool_delete_result(r,1);
  }
  t_pool_delete_result(r,0);
  return -1;
}

Assistant:

static int cram_flush_result(cram_fd *fd) {
    int i, ret = 0;
    t_pool_result *r;

    while ((r = t_pool_next_result(fd->rqueue))) {
	cram_job *j = (cram_job *)r->data;
	cram_container *c;

	if (!j) {
	    t_pool_delete_result(r, 0);
	    return -1;
	}

	fd = j->fd;
	c = j->c;

	if (0 != cram_flush_container2(fd, c))
	    return -1;

	/* Free the container */
	for (i = 0; i < c->max_slice; i++) {
	    cram_free_slice(c->slices[i]);
	    c->slices[i] = NULL;
	}

	c->slice = NULL;
	c->curr_slice = 0;

	cram_free_container(c);

	ret |= hflush(fd->fp) == 0 ? 0 : -1;

	t_pool_delete_result(r, 1);
    }

    return ret;
}